

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_fortran_array_view.cpp
# Opt level: O0

void __thiscall
cpp_bindgen::cpp_bindgen::anon_unknown_0::WrappableStaticHypercubeWithMetaTypes<4UL>::
WrappableStaticHypercubeWithMetaTypes
          (WrappableStaticHypercubeWithMetaTypes<4UL> *this,
          bindgen_fortran_array_descriptor *descriptor)

{
  runtime_error *prVar1;
  int local_28;
  int i;
  bindgen_fortran_array_descriptor *descriptor_local;
  WrappableStaticHypercubeWithMetaTypes<4UL> *this_local;
  
  if (descriptor->type != bindgen_fk_Double) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"type does not match");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_28 = 0;
  while( true ) {
    if (descriptor->rank <= local_28) {
      this->data_ = (double *)descriptor->data;
      return;
    }
    if (descriptor->dims[local_28] != 2) break;
    local_28 = local_28 + 1;
  }
  prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar1,"dimensions must be 2");
  __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

WrappableStaticHypercubeWithMetaTypes(const bindgen_fortran_array_descriptor &descriptor) {
                    if (descriptor.type != bindgen_fk_Double) {
                        throw std::runtime_error("type does not match");
                    }
                    for (int i = 0; i < descriptor.rank; ++i)
                        if (descriptor.dims[i] != 2)
                            throw std::runtime_error("dimensions must be 2");

                    data_ = reinterpret_cast<double *>(descriptor.data);
                }